

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  Queue<unsigned_int> *this_00;
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  uint *puVar3;
  vec<unsigned_int,_int> *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  undefined8 uStack_38;
  
  if (this->n_touched != 0) {
    this_00 = &this->subsumption_queue;
    iVar2 = (this->subsumption_queue).end;
    iVar5 = (this->subsumption_queue).buf.sz;
    iVar6 = (this->subsumption_queue).first;
    iVar7 = 0;
    iVar9 = 0;
    if (iVar2 < iVar6) {
      iVar9 = iVar5;
    }
    iVar10 = iVar9 + (iVar2 - iVar6);
    uStack_38 = in_RAX;
    if (iVar10 != 0 && SCARRY4(iVar9,iVar2 - iVar6) == iVar10 < 0) {
      do {
        puVar3 = Queue<unsigned_int>::operator[](this_00,iVar7);
        if ((this->super_Solver).ca.ra.sz <= *puVar3) goto LAB_001113cd;
        if (((this->super_Solver).ca.ra.memory[*puVar3] & 3) == 0) {
          puVar3 = Queue<unsigned_int>::operator[](this_00,iVar7);
          uVar1 = *puVar3;
          if ((this->super_Solver).ca.ra.sz <= uVar1) goto LAB_001113cd;
          puVar3 = (this->super_Solver).ca.ra.memory;
          puVar3[uVar1] = puVar3[uVar1] & 0xfffffffc | 2;
        }
        iVar7 = iVar7 + 1;
        iVar2 = (this->subsumption_queue).end;
        iVar5 = (this->subsumption_queue).buf.sz;
        iVar6 = (this->subsumption_queue).first;
        iVar9 = 0;
        if (iVar2 < iVar6) {
          iVar9 = iVar5;
        }
      } while (iVar7 < (iVar2 - iVar6) + iVar9);
    }
    uStack_38 = uStack_38 & 0xffffffff;
    iVar9 = (this->super_Solver).next_var;
    if (0 < iVar9) {
      iVar2 = 0;
      do {
        if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar2)
        {
LAB_001113ec:
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                        ,0x28,
                        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar2]
            != '\0') {
          pvVar4 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                   ::lookup(&this->occurs,(int *)((long)&uStack_38 + 4));
          iVar2 = pvVar4->sz;
          if (0 < iVar2) {
            lVar8 = 0;
            do {
              uVar1 = pvVar4->data[lVar8];
              if ((this->super_Solver).ca.ra.sz <= uVar1) goto LAB_001113cd;
              if (((this->super_Solver).ca.ra.memory[uVar1] & 3) == 0) {
                Queue<unsigned_int>::insert(this_00,uVar1);
                uVar1 = pvVar4->data[lVar8];
                if ((this->super_Solver).ca.ra.sz <= uVar1) goto LAB_001113cd;
                puVar3 = (this->super_Solver).ca.ra.memory;
                puVar3[uVar1] = puVar3[uVar1] & 0xfffffffc | 2;
                iVar2 = pvVar4->sz;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar2);
          }
          if ((this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
              uStack_38._4_4_) goto LAB_001113ec;
          (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
          [uStack_38._4_4_] = '\0';
          iVar9 = (this->super_Solver).next_var;
          iVar2 = uStack_38._4_4_;
        }
        iVar2 = iVar2 + 1;
        uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      } while (iVar2 < iVar9);
      iVar2 = (this->subsumption_queue).end;
      iVar5 = (this->subsumption_queue).buf.sz;
      iVar6 = (this->subsumption_queue).first;
    }
    iVar9 = 0;
    uStack_38 = uStack_38 & 0xffffffff;
    if (iVar6 <= iVar2) {
      iVar5 = 0;
    }
    iVar7 = iVar5 + (iVar2 - iVar6);
    if (iVar7 != 0 && SCARRY4(iVar5,iVar2 - iVar6) == iVar7 < 0) {
      do {
        puVar3 = Queue<unsigned_int>::operator[](this_00,iVar9);
        if ((this->super_Solver).ca.ra.sz <= *puVar3) {
LAB_001113cd:
          __assert_fail("r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Alloc.h"
                        ,0x3f,
                        "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        if (((this->super_Solver).ca.ra.memory[*puVar3] & 3) == 2) {
          puVar3 = Queue<unsigned_int>::operator[](this_00,uStack_38._4_4_);
          if ((this->super_Solver).ca.ra.sz <= *puVar3) goto LAB_001113cd;
          puVar3 = (this->super_Solver).ca.ra.memory + *puVar3;
          *puVar3 = *puVar3 & 0xfffffffc;
        }
        iVar9 = uStack_38._4_4_ + 1;
        uStack_38 = CONCAT44(iVar9,(undefined4)uStack_38);
        iVar2 = (this->subsumption_queue).end;
        iVar6 = 0;
        iVar5 = (this->subsumption_queue).first;
        if (iVar2 < iVar5) {
          iVar6 = (this->subsumption_queue).buf.sz;
        }
      } while (iVar9 < (iVar2 - iVar5) + iVar6);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}